

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcGraft.c
# Opt level: O1

Vec_Int_t * Sbc_ManDetectMult(Gia_Man_t *p,Vec_Int_t *vIns)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  ulong uVar4;
  word **ppwVar5;
  Vec_Int_t *pVVar6;
  int *__s;
  Vec_Mem_t *p_00;
  Vec_Wrd_t *pVVar7;
  word *pwVar8;
  int *piVar9;
  uint uVar10;
  uint uVar11;
  word *pwVar12;
  long lVar13;
  int iVar14;
  word *pwVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  word B [64];
  word A [64];
  word R [128];
  word local_838 [64];
  word local_638 [64];
  word local_438 [129];
  
  iVar17 = p->nObjs;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  iVar16 = 0x10;
  if (0xe < iVar17 - 1U) {
    iVar16 = iVar17;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar16;
  if (iVar16 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar16 << 2);
  }
  lVar18 = (long)iVar17;
  pVVar6->pArray = __s;
  pVVar6->nSize = iVar17;
  if (__s != (int *)0x0) {
    memset(__s,0xff,lVar18 * 4);
  }
  iVar17 = vIns->nSize;
  iVar16 = iVar17 / 2;
  p_00 = (Vec_Mem_t *)calloc(1,0x30);
  p_00->nEntrySize = 1;
  p_00->LogPageSze = 10;
  p_00->PageMask = 0x3ff;
  p_00->iPage = -1;
  Vec_MemHashAlloc(p_00,1000);
  pwVar12 = local_638;
  pwVar8 = local_438;
  Sbc_SimMult(pwVar12,local_838,pwVar8,iVar16);
  uVar11 = iVar17 - (iVar17 >> 0x1f) & 0xfffffffe;
  if (1 < iVar17) {
    uVar19 = 1;
    if (1 < (int)uVar11) {
      uVar19 = (ulong)uVar11;
    }
    do {
      Vec_MemHashInsert(p_00,pwVar8);
      pwVar8 = pwVar8 + 1;
      uVar19 = uVar19 - 1;
    } while (uVar19 != 0);
  }
  if (p_00->nEntries != uVar11) {
    __assert_fail("Vec_MemEntryNum(vTtMem) == 2*nIns",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcGraft.c"
                  ,0x16e,"Vec_Int_t *Sbc_ManDetectMult(Gia_Man_t *, Vec_Int_t *)");
  }
  if (p->vSims != (Vec_Wrd_t *)0x0) {
    pwVar8 = p->vSims->pArray;
    if (pwVar8 != (word *)0x0) {
      free(pwVar8);
      p->vSims->pArray = (word *)0x0;
    }
    if (p->vSims != (Vec_Wrd_t *)0x0) {
      free(p->vSims);
      p->vSims = (Vec_Wrd_t *)0x0;
    }
  }
  iVar17 = p->nObjs;
  pVVar7 = (Vec_Wrd_t *)malloc(0x10);
  iVar14 = 0x10;
  if (0xe < iVar17 - 1U) {
    iVar14 = iVar17;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = iVar14;
  if (iVar14 == 0) {
    pwVar8 = (word *)0x0;
  }
  else {
    pwVar8 = (word *)malloc((long)iVar14 << 3);
  }
  pVVar7->pArray = pwVar8;
  pVVar7->nSize = iVar17;
  memset(pwVar8,0,(long)iVar17 << 3);
  p->vSims = pVVar7;
  p->nSimWords = 1;
  Gia_ManIncrementTravId(p);
  if (p->nTravIdsAlloc < 1) {
    __assert_fail("Id < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x266,"void Gia_ObjSetTravIdCurrentId(Gia_Man_t *, int)");
  }
  piVar9 = p->pTravIds;
  *piVar9 = p->nTravIds;
  pVVar2 = p->vCis;
  if (0 < pVVar2->nSize) {
    piVar3 = pVVar2->pArray;
    lVar13 = 0;
    do {
      iVar17 = piVar3[lVar13];
      if (((long)iVar17 < 0) || (p->nObjs <= iVar17)) goto LAB_0035b6f3;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (p->nTravIdsAlloc <= iVar17) goto LAB_0035b712;
      piVar9[iVar17] = p->nTravIds;
      lVar13 = lVar13 + 1;
    } while (lVar13 < pVVar2->nSize);
  }
  if ((vIns->nSize & 1) != 0) {
    __assert_fail("Vec_IntSize(vIns) % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcGraft.c"
                  ,0x17f,"Vec_Int_t *Sbc_ManDetectMult(Gia_Man_t *, Vec_Int_t *)");
  }
  if (0 < vIns->nSize) {
    piVar3 = vIns->pArray;
    pwVar8 = local_838 + -(long)iVar16;
    lVar13 = 0;
    do {
      iVar17 = piVar3[lVar13];
      if (((long)iVar17 < 0) || (p->nObjs <= iVar17)) goto LAB_0035b6f3;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (p->nTravIdsAlloc <= iVar17) {
LAB_0035b712:
        __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x262,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
      }
      piVar9[iVar17] = p->nTravIds;
      if (p->nObjs <= iVar17) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar11 = iVar17 * p->nSimWords;
      if (((int)uVar11 < 0) || (p->vSims->nSize <= (int)uVar11)) goto LAB_0035b6d4;
      pwVar15 = pwVar8;
      if (lVar13 < iVar16) {
        pwVar15 = pwVar12;
      }
      p->vSims->pArray[uVar11] = *pwVar15;
      lVar13 = lVar13 + 1;
      pwVar8 = pwVar8 + 1;
      pwVar12 = pwVar12 + 1;
    } while (lVar13 < vIns->nSize);
  }
  iVar17 = p->nObjs;
  if (1 < iVar17) {
    lVar13 = 1;
    do {
      if (p->nTravIdsAlloc <= lVar13) {
        __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x264,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
      }
      if (p->pTravIds[lVar13] != p->nTravIds) {
        uVar11 = (uint)*(ulong *)(p->pObjs + lVar13);
        uVar19 = *(ulong *)(p->pObjs + lVar13) & 0x1fffffff;
        iVar17 = (int)lVar13;
        if (uVar19 == 0x1fffffff || (int)uVar11 < 0) {
          if ((-1 < (int)uVar11) || ((int)uVar19 == 0x1fffffff)) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcGraft.c"
                          ,0x191,"Vec_Int_t *Sbc_ManDetectMult(Gia_Man_t *, Vec_Int_t *)");
          }
          uVar1 = p->nSimWords;
          if ((int)(iVar17 * uVar1) < 0) goto LAB_0035b6d4;
          iVar16 = p->vSims->nSize;
          if (iVar16 <= (int)(iVar17 * uVar1)) goto LAB_0035b6d4;
          uVar10 = uVar11 & 0x1fffffff;
          iVar14 = (iVar17 - uVar10) * uVar1;
          if ((iVar14 < 0) || (iVar16 <= iVar14)) goto LAB_0035b6d4;
          pwVar12 = p->vSims->pArray;
          if ((uVar11 >> 0x1d & 1) == 0) {
            if (0 < (int)uVar1) {
              uVar19 = 0;
              do {
                pwVar12[uVar1 * iVar17 + uVar19] = pwVar12[(iVar17 - uVar10) * uVar1 + uVar19];
                uVar19 = uVar19 + 1;
              } while (uVar1 != uVar19);
            }
          }
          else if (0 < (int)uVar1) {
            uVar19 = 0;
            do {
              pwVar12[uVar1 * iVar17 + uVar19] = ~pwVar12[(iVar17 - uVar10) * uVar1 + uVar19];
              uVar19 = uVar19 + 1;
            } while (uVar1 != uVar19);
          }
        }
        else {
          Wlc_ObjSimAnd(p,iVar17);
        }
        uVar11 = p->nSimWords * iVar17;
        if (((int)uVar11 < 0) || (p->vSims->nSize <= (int)uVar11)) goto LAB_0035b6d4;
        pwVar12 = p->vSims->pArray + uVar11;
        piVar9 = Vec_MemHashLookup(p_00,pwVar12);
        if (*piVar9 < 0) {
          uVar19 = *pwVar12;
          *pwVar12 = ~uVar19;
          piVar9 = Vec_MemHashLookup(p_00,pwVar12);
          iVar17 = *piVar9;
          uVar4 = *pwVar12;
          *pwVar12 = ~uVar4;
          if (uVar19 != ~uVar4) {
            __assert_fail("Temp == *pInfoObj",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcGraft.c"
                          ,0x1a1,"Vec_Int_t *Sbc_ManDetectMult(Gia_Man_t *, Vec_Int_t *)");
          }
          if (iVar17 < 0) goto LAB_0035b5ab;
          if (lVar18 <= lVar13) goto LAB_0035b76f;
          iVar17 = iVar17 * 2 + 1;
        }
        else {
          if (lVar18 <= lVar13) {
LAB_0035b76f:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          iVar17 = *piVar9 * 2;
        }
        __s[lVar13] = iVar17;
      }
LAB_0035b5ab:
      lVar13 = lVar13 + 1;
      iVar17 = p->nObjs;
    } while (lVar13 < iVar17);
  }
  lVar18 = (long)p->vCos->nSize;
  if (0 < lVar18) {
    lVar13 = 0;
    do {
      iVar16 = p->vCos->pArray[lVar13];
      if ((iVar16 < 0) || (iVar17 <= iVar16)) {
LAB_0035b6f3:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      iVar16 = iVar16 * p->nSimWords;
      if ((iVar16 < 0) || (p->vSims->nSize <= iVar16)) {
LAB_0035b6d4:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      lVar13 = lVar13 + 1;
    } while (lVar18 != lVar13);
  }
  pVVar2 = p_00->vTable;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    if (pVVar2->pArray != (int *)0x0) {
      free(pVVar2->pArray);
      pVVar2->pArray = (int *)0x0;
    }
    free(pVVar2);
    p_00->vTable = (Vec_Int_t *)0x0;
  }
  pVVar2 = p_00->vNexts;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    if (pVVar2->pArray != (int *)0x0) {
      free(pVVar2->pArray);
      pVVar2->pArray = (int *)0x0;
    }
    free(pVVar2);
    p_00->vNexts = (Vec_Int_t *)0x0;
  }
  uVar11 = p_00->iPage;
  if (-1 < (int)uVar11) {
    ppwVar5 = p_00->ppPages;
    lVar18 = 0;
    do {
      pwVar12 = ppwVar5[lVar18];
      if (pwVar12 != (word *)0x0) {
        free(pwVar12);
        ppwVar5[lVar18] = (word *)0x0;
      }
      lVar18 = lVar18 + 1;
    } while ((ulong)uVar11 + 1 != lVar18);
  }
  if (p_00->ppPages != (word **)0x0) {
    free(p_00->ppPages);
    p_00->ppPages = (word **)0x0;
  }
  free(p_00);
  return pVVar6;
}

Assistant:

Vec_Int_t * Sbc_ManDetectMult( Gia_Man_t * p, Vec_Int_t * vIns )
{
    int nWords = 1;
    Vec_Int_t * vGia2Out = Vec_IntStartFull( Gia_ManObjNum(p) );
    Gia_Obj_t * pObj; int i, Entry, nIns = Vec_IntSize(vIns)/2;
    word A[64], B[64], R[128], * pInfoObj; word Temp;

    // create hash table
    Vec_Mem_t * vTtMem = Vec_MemAlloc( nWords, 10 );
    Vec_MemHashAlloc( vTtMem, 1000 );
    Sbc_SimMult( A, B, R, nIns );
    for ( i = 0; i < 2*nIns; i++ )
    {
        Vec_MemHashInsert( vTtMem, R+i );
        //printf( "Out %2d : ", i );
        //Extra_PrintHex( stdout, (unsigned *)(R+i), 6 ); printf( "\n" );
    }
    assert( Vec_MemEntryNum(vTtMem) == 2*nIns );

    // alloc simulation info
    Vec_WrdFreeP( &p->vSims );
    p->vSims = Vec_WrdStart( Gia_ManObjNum(p) * nWords );
    p->nSimWords = nWords;

    // mark inputs
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrentId( p, 0 );
    Gia_ManForEachCi( p, pObj, i )
    {
        Gia_ObjSetTravIdCurrent( p, pObj );
        //Wlc_ObjSimPi( p, Gia_ObjId(p, pObj) );
    }

    // assign inputs
    assert( Vec_IntSize(vIns) % 2 == 0 );
    Gia_ManForEachObjVec( vIns, p, pObj, i )
    {
        Gia_ObjSetTravIdCurrent( p, pObj );
        pInfoObj = Wlc_ObjSim( p, Gia_ObjId(p, pObj) );
        *pInfoObj = i < nIns ? A[i] : B[i - nIns];
    }

    // perform simulation
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsTravIdCurrent(p, pObj) )
            continue;

        if ( Gia_ObjIsAnd(pObj) )
            Wlc_ObjSimAnd( p, i );
        else if ( Gia_ObjIsCo(pObj) )
            Wlc_ObjSimCo( p, i );
        else assert( 0 );

        // mark direct polarity
        pInfoObj = Wlc_ObjSim( p, i );
        Entry = *Vec_MemHashLookup( vTtMem, pInfoObj );
        if ( Entry >= 0 )
        {
            Vec_IntWriteEntry( vGia2Out, i, Abc_Var2Lit(Entry, 0) );
            continue;
        }

        // mark negated polarity
        Temp = *pInfoObj;
        Abc_TtNot( pInfoObj, nWords );
        Entry = *Vec_MemHashLookup( vTtMem, pInfoObj );
        Abc_TtNot( pInfoObj, nWords );
        assert( Temp == *pInfoObj );
        if ( Entry >= 0 )
        {
            Vec_IntWriteEntry( vGia2Out, i, Abc_Var2Lit(Entry, 1) );
            continue;
        }
    }

    Gia_ManForEachCo( p, pObj, i )
    {
        pInfoObj = Wlc_ObjSim( p, Gia_ObjId(p, pObj) );
        //printf( "Out %2d : Driver = %5d(%d)", i, Gia_ObjFaninId0p(p, pObj), Gia_ObjFaninC0(pObj) );
        //Extra_PrintHex( stdout, (unsigned *)pInfoObj, 6 ); printf( "\n" );
    }

    // cleanup
    Vec_MemHashFree( vTtMem );
    Vec_MemFreeP( &vTtMem );
    //Vec_WrdFreeP( &p->vSims );
    //p->nSimWords = 0;
    return vGia2Out;
}